

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml2.h
# Opt level: O3

void __thiscall tinyxml2::MemPoolT<80>::~MemPoolT(MemPoolT<80> *this)

{
  ~MemPoolT(this);
  operator_delete(this);
  return;
}

Assistant:

~MemPoolT() {
        MemPoolT< ITEM_SIZE >::Clear();
    }